

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O1

void __thiscall
rapidjson::internal::BigInteger::AppendDecimal64(BigInteger *this,char *begin,char *end)

{
  uint64_t u;
  BigInteger *pBVar1;
  
  u = ParseUint64(begin,end);
  if ((this->count_ == 1) && (this->digits_[0] == 0)) {
    this->digits_[0] = u;
    this->count_ = 1;
    return;
  }
  pBVar1 = MultiplyPow5(this,(uint)((long)end - (long)begin));
  pBVar1 = operator<<=(pBVar1,(long)end - (long)begin & 0xffffffff);
  operator+=(pBVar1,u);
  return;
}

Assistant:

void AppendDecimal64(const char* begin, const char* end) {
        uint64_t u = ParseUint64(begin, end);
        if (IsZero())
            *this = u;
        else {
            unsigned exp = static_cast<unsigned>(end - begin);
            (MultiplyPow5(exp) <<= exp) += u;   // *this = *this * 10^exp + u
        }
    }